

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

iter_type __thiscall
booster::locale::impl_icu::num_format<wchar_t>::do_real_put<long>
          (num_format<wchar_t> *this,iter_type out,ios_base *ios,char_type_conflict fill,long val)

{
  char_type_conflict *pcVar1;
  formatter<wchar_t> fVar2;
  bool bVar3;
  char_type_conflict cVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  streamsize n;
  long lVar8;
  iter_type iVar9;
  iter_type iVar10;
  size_t code_points;
  long local_58;
  formatter<wchar_t> local_50;
  long local_48;
  undefined1 local_40 [16];
  
  iVar10._M_sbuf = out._M_sbuf;
  uVar7 = out._8_4_;
  bVar3 = num_base::use_parent<long>(ios,val);
  if ((bVar3) ||
     (formatter<wchar_t>::create(&local_50,ios,&this->loc_,&this->enc_),
     fVar2.super_base_formatter._vptr_base_formatter =
          local_50.super_base_formatter._vptr_base_formatter,
     local_50.super_base_formatter._vptr_base_formatter == (_func_int **)0x0)) {
    iVar10._8_4_ = uVar7 & 0xff;
    iVar10._12_4_ = 0;
    iVar10 = std::num_put<wchar_t,_std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>_>::
             _M_insert_int<long>(&this->
                                  super_num_put<wchar_t,_std::ostreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>_>
                                 ,iVar10,ios,fill,val);
    uVar7 = iVar10._8_4_;
  }
  else {
    (**(code **)(*(_func_int **)local_50.super_base_formatter._vptr_base_formatter + 0x18))
              (&local_50,local_50.super_base_formatter._vptr_base_formatter,val);
    lVar8 = *(long *)(ios + 0x10) - local_58;
    if (lVar8 == 0 || *(long *)(ios + 0x10) < local_58) {
      lVar6 = 0;
    }
    else {
      lVar5 = 0;
      if ((*(uint *)(ios + 0x18) & 0xb0) != 0x20) {
        lVar5 = lVar8;
      }
      lVar6 = lVar8 - lVar5;
      if (0 < lVar5) {
        lVar8 = lVar8 + 1;
        do {
          if ((uVar7 & 1) == 0) {
            pcVar1 = *(char_type_conflict **)(iVar10._M_sbuf + 0x28);
            if (pcVar1 < *(char_type_conflict **)(iVar10._M_sbuf + 0x30)) {
              *pcVar1 = fill;
              *(char_type_conflict **)(iVar10._M_sbuf + 0x28) = pcVar1 + 1;
              cVar4 = fill;
            }
            else {
              cVar4 = (**(code **)(*(long *)iVar10._M_sbuf + 0x68))(iVar10._M_sbuf,fill);
            }
            uVar7 = uVar7 & 0xff;
            if (cVar4 == -1) {
              uVar7 = 1;
            }
          }
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
    }
    if ((0 < local_48) && ((uVar7 & 1) == 0)) {
      (**(code **)(*(long *)iVar10._M_sbuf + 0x60))
                (iVar10._M_sbuf,local_50.super_base_formatter._vptr_base_formatter);
    }
    if (0 < lVar6) {
      lVar6 = lVar6 + 1;
      do {
        if ((uVar7 & 1) == 0) {
          pcVar1 = *(char_type_conflict **)(iVar10._M_sbuf + 0x28);
          if (pcVar1 < *(char_type_conflict **)(iVar10._M_sbuf + 0x30)) {
            *pcVar1 = fill;
            *(char_type_conflict **)(iVar10._M_sbuf + 0x28) = pcVar1 + 1;
            cVar4 = fill;
          }
          else {
            cVar4 = (**(code **)(*(long *)iVar10._M_sbuf + 0x68))(iVar10._M_sbuf,fill);
          }
          uVar7 = uVar7 & 0xff;
          if (cVar4 == -1) {
            uVar7 = 1;
          }
        }
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
    *(undefined8 *)(ios + 0x10) = 0;
    if (local_50.super_base_formatter._vptr_base_formatter != (base_formatter)local_40) {
      operator_delete((void *)local_50.super_base_formatter._vptr_base_formatter);
    }
    (**(code **)(*(_func_int **)fVar2.super_base_formatter._vptr_base_formatter + 8))();
  }
  iVar9._8_4_ = uVar7;
  iVar9._M_sbuf = iVar10._M_sbuf;
  iVar9._12_4_ = 0;
  return iVar9;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        formatter_ptr formatter;
        
        if(use_parent<ValueType>(ios,val) || (formatter = formatter_type::create(ios,loc_,enc_)).get() == 0) {
            return std::num_put<char_type>::do_put(out,ios,fill,val);
        }
        
        size_t code_points;
        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type const &str = formatter->format(static_cast<cast_type>(val),code_points);
        std::streamsize on_left=0,on_right = 0,points = code_points;
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // We do not really know internal point, so we assume that it does not
            // exist. So according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;

    }